

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

GLFWbool waitForEvent(double *timeout)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auStack_d8 [8];
  fd_set fds;
  undefined1 local_48 [8];
  timeval tv;
  
  iVar2 = *(int *)(_glfw.x11.display + 0x10);
  auStack_d8 = (undefined1  [8])0x0;
  fds.__fds_bits[0] = 0;
  fds.__fds_bits[1] = 0;
  fds.__fds_bits[2] = 0;
  fds.__fds_bits[3] = 0;
  fds.__fds_bits[4] = 0;
  fds.__fds_bits[5] = 0;
  fds.__fds_bits[6] = 0;
  fds.__fds_bits[7] = 0;
  fds.__fds_bits[8] = 0;
  fds.__fds_bits[9] = 0;
  fds.__fds_bits[10] = 0;
  fds.__fds_bits[0xb] = 0;
  fds.__fds_bits[0xc] = 0;
  fds.__fds_bits[0xd] = 0;
  fds.__fds_bits[0xe] = 0;
  iVar7 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar7 = iVar2;
  }
  fds.__fds_bits[(long)(iVar7 >> 6) + -1] =
       fds.__fds_bits[(long)(iVar7 >> 6) + -1] | 1L << ((byte)iVar2 & 0x3f);
  iVar7 = _glfw.linux_js.inotify + 0x3f;
  if (-1 < _glfw.linux_js.inotify) {
    iVar7 = _glfw.linux_js.inotify;
  }
  fds.__fds_bits[(long)(iVar7 >> 6) + -1] =
       fds.__fds_bits[(long)(iVar7 >> 6) + -1] | 1L << ((byte)_glfw.linux_js.inotify & 0x3f);
  iVar7 = _glfw.linux_js.inotify;
  if (_glfw.linux_js.inotify < iVar2) {
    iVar7 = iVar2;
  }
  do {
    while (timeout != (double *)0x0) {
      local_48 = (undefined1  [8])(long)*timeout;
      tv.tv_sec = (__time_t)((*timeout - (double)(long)local_48) * 1000000.0);
      uVar4 = _glfwPlatformGetTimerValue();
      iVar2 = select(iVar7 + 1,(fd_set *)auStack_d8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_48)
      ;
      piVar3 = __errno_location();
      tv.tv_usec._4_4_ = *piVar3;
      uVar5 = _glfwPlatformGetTimerValue();
      lVar6 = uVar5 - uVar4;
      auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = 0x45300000;
      fds.__fds_bits[0xf] =
           (__fd_mask)
           ((auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
      uVar4 = _glfwPlatformGetTimerFrequency();
      auVar10._8_4_ = (int)(uVar4 >> 0x20);
      auVar10._0_8_ = uVar4;
      auVar10._12_4_ = 0x45300000;
      dVar8 = *timeout -
              (double)fds.__fds_bits[0xf] /
              ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
      *timeout = dVar8;
      if (iVar2 < 1) {
        bVar1 = 0.0 < dVar8 && (tv.tv_usec._4_4_ != 4 || iVar2 != -1);
        if (0.0 >= dVar8 || tv.tv_usec._4_4_ == 4 && iVar2 == -1) {
          tv.tv_usec._0_4_ = 0;
        }
      }
      else {
        tv.tv_usec._0_4_ = 1;
        bVar1 = false;
      }
      if (!bVar1) {
        return (GLFWbool)tv.tv_usec;
      }
    }
    iVar2 = select(iVar7 + 1,(fd_set *)auStack_d8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if (iVar2 != -1) {
      return 1;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  return 1;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

    FD_ZERO(&fds);
    FD_SET(fd, &fds);
#if defined(__linux__)
    FD_SET(_glfw.linux_js.inotify, &fds);

    if (fd < _glfw.linux_js.inotify)
        count = _glfw.linux_js.inotify + 1;
#endif
    for (;;)
    {
        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}